

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  bool bVar4;
  uint8_t uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  run_container_t *prVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint64_t unaff_R14;
  ushort x_00;
  
  lVar16 = (long)(bm->high_low_container).size;
  uVar10 = 0;
  uVar11 = uVar10;
  if (0 < lVar16) {
    uVar18 = x >> 0x10;
    puVar3 = (bm->high_low_container).keys;
    lVar17 = 0;
    do {
      uVar1 = puVar3[lVar17];
      if (uVar1 < uVar18) {
        prVar15 = (run_container_t *)(bm->high_low_container).containers[lVar17];
        uVar5 = (bm->high_low_container).typecodes[lVar17];
        if (uVar5 == '\x04') {
          uVar5 = *(uint8_t *)&prVar15->runs;
          if (uVar5 == '\x04') {
LAB_0011ca3d:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          prVar15 = *(run_container_t **)prVar15;
        }
        if (uVar5 == '\x03') {
          lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
          if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
            iVar8 = prVar15->n_runs;
            lVar9 = (long)iVar8;
            if (0 < lVar9) {
              lVar12 = 0;
              do {
                iVar8 = iVar8 + (uint)prVar15->runs[lVar12].length;
                lVar12 = lVar12 + 1;
              } while (lVar9 != lVar12);
            }
          }
          else {
            iVar8 = _avx2_run_container_cardinality(prVar15);
          }
        }
        else {
          if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
          }
          iVar8 = prVar15->n_runs;
        }
        uVar10 = uVar10 + (long)iVar8;
      }
      else {
        unaff_R14 = uVar10;
        if (uVar18 == uVar1) {
          prVar15 = (run_container_t *)(bm->high_low_container).containers[lVar17];
          bVar6 = (bm->high_low_container).typecodes[lVar17];
          if (bVar6 == 4) {
            bVar6 = *(byte *)&prVar15->runs;
            if (bVar6 == 4) goto LAB_0011ca3d;
            prVar15 = *(run_container_t **)prVar15;
          }
          x_00 = (ushort)x;
          if (bVar6 == 3) {
            uVar7 = run_container_rank(prVar15,x_00);
          }
          else if (bVar6 == 2) {
            iVar8 = prVar15->n_runs + -1;
            uVar14 = 0;
            uVar7 = (uint)bVar6;
            do {
              if (iVar8 < (int)uVar14) {
                uVar13 = ~uVar14;
                break;
              }
              uVar13 = uVar14 + iVar8 >> 1;
              uVar2 = *(ushort *)
                       ((long)&prVar15->runs->value + (ulong)(uVar14 + iVar8 & 0xfffffffe));
              if (uVar2 < x_00) {
                uVar14 = uVar13 + 1;
                bVar4 = true;
                uVar13 = uVar7;
              }
              else if (x_00 < uVar2) {
                iVar8 = uVar13 - 1;
                bVar4 = true;
                uVar13 = uVar7;
              }
              else {
                bVar4 = false;
              }
              uVar7 = uVar13;
            } while (bVar4);
            uVar7 = ~uVar13;
            if (-1 < (int)uVar13) {
              uVar7 = uVar13 + 1;
            }
          }
          else {
            if (bVar6 != 1) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x18ee,"int container_rank(const container_t *, uint8_t, uint16_t)");
            }
            uVar7 = bitset_container_rank((bitset_container_t *)prVar15,x_00);
          }
          unaff_R14 = (long)(int)uVar7 + uVar10;
        }
      }
      uVar11 = unaff_R14;
    } while ((uVar1 < uVar18) && (lVar17 = lVar17 + 1, uVar11 = uVar10, lVar17 != lVar16));
  }
  return uVar11;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}